

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

l_mem objsize(GCObject *o)

{
  size_t sVar1;
  lu_mem lVar2;
  long lVar3;
  
  switch(o->tt) {
  case '\x04':
    return (ulong)((int)(char)o->field_0xb + 1) + 0x18;
  case '\x05':
    lVar2 = luaH_size((Table *)o);
    return lVar2;
  case '\x06':
    return (ulong)(byte)o->field_0xa * 8 + 0x20;
  case '\a':
    lVar3 = 0x20;
    if (*(ushort *)&o->field_0xa != 0) {
      lVar3 = (ulong)*(ushort *)&o->field_0xa * 0x10 + 0x28;
    }
    return (long)&(o[1].next)->next + lVar3;
  case '\b':
    lVar2 = luaE_threadsize((lua_State *)o);
    return lVar2;
  case '\t':
    return 0x28;
  case '\n':
    lVar2 = luaF_protosize((Proto *)o);
    return lVar2;
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    goto switchD_0010e12a_caseD_b;
  case '\x14':
    sVar1 = luaS_sizelngstr((size_t)o[1].next,(int)(char)o->field_0xb);
    return sVar1;
  default:
    if (o->tt == '&') {
      return (ulong)(byte)o->field_0xa * 0x10 + 0x20;
    }
switchD_0010e12a_caseD_b:
    return 0;
  }
}

Assistant:

static l_mem objsize (GCObject *o) {
  lu_mem res;
  switch (o->tt) {
    case LUA_VTABLE: {
      res = luaH_size(gco2t(o));
      break;
    }
    case LUA_VLCL: {
      LClosure *cl = gco2lcl(o);
      res = sizeLclosure(cl->nupvalues);
      break;
    }
    case LUA_VCCL: {
      CClosure *cl = gco2ccl(o);
      res = sizeCclosure(cl->nupvalues);
      break;
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      res = sizeudata(u->nuvalue, u->len);
      break;
    }
    case LUA_VPROTO: {
      res = luaF_protosize(gco2p(o));
      break;
    }
    case LUA_VTHREAD: {
      res = luaE_threadsize(gco2th(o));
      break;
    }
    case LUA_VSHRSTR: {
      TString *ts = gco2ts(o);
      res = sizestrshr(cast_uint(ts->shrlen));
      break;
    }
    case LUA_VLNGSTR: {
      TString *ts = gco2ts(o);
      res = luaS_sizelngstr(ts->u.lnglen, ts->shrlen);
      break;
    }
    case LUA_VUPVAL: {
      res = sizeof(UpVal);
      break;
    }
    default: res = 0; lua_assert(0);
  }
  return cast(l_mem, res);
}